

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int remainingElementsCount_add(JSContext *ctx,JSValue resolve_element_env,int addend)

{
  int iVar1;
  uint uVar2;
  JSValue val;
  int local_2c;
  
  val = JS_GetPropertyValue(ctx,resolve_element_env,(JSValue)ZEXT816(0));
  uVar2 = 0xffffffff;
  if ((int)val.tag != 6) {
    iVar1 = JS_ToInt32Free(ctx,&local_2c,val);
    if (iVar1 == 0) {
      iVar1 = JS_SetPropertyValue(ctx,resolve_element_env,(JSValue)ZEXT816(0),
                                  (JSValue)(ZEXT816(0x4000) << 0x40),addend + local_2c);
      if (-1 < iVar1) {
        uVar2 = (uint)(addend + local_2c == 0);
      }
    }
  }
  return uVar2;
}

Assistant:

static __exception int remainingElementsCount_add(JSContext *ctx,
                                                  JSValueConst resolve_element_env,
                                                  int addend)
{
    JSValue val;
    int remainingElementsCount;

    val = JS_GetPropertyUint32(ctx, resolve_element_env, 0);
    if (JS_IsException(val))
        return -1;
    if (JS_ToInt32Free(ctx, &remainingElementsCount, val))
        return -1;
    remainingElementsCount += addend;
    if (JS_SetPropertyUint32(ctx, resolve_element_env, 0,
                             JS_NewInt32(ctx, remainingElementsCount)) < 0)
        return -1;
    return (remainingElementsCount == 0);
}